

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

value loader_metadata(void)

{
  undefined8 uVar1;
  value v;
  loader_metadata_cb_iterator_type metadata_iterator;
  undefined8 local_18;
  undefined8 local_10;
  value local_8;
  
  uVar1 = plugin_manager_size(&loader_manager);
  local_8 = (value)value_create_map(0,uVar1);
  if (local_8 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    local_18 = 0;
    local_10 = value_to_map(local_8);
    plugin_manager_iterate(&loader_manager,loader_metadata_cb_iterate,&local_18);
  }
  return local_8;
}

Assistant:

value loader_metadata(void)
{
	struct loader_metadata_cb_iterator_type metadata_iterator;
	value v = value_create_map(NULL, plugin_manager_size(&loader_manager));

	if (v == NULL)
	{
		return NULL;
	}

	metadata_iterator.iterator = 0;
	metadata_iterator.values = value_to_map(v);

	plugin_manager_iterate(&loader_manager, &loader_metadata_cb_iterate, (void *)&metadata_iterator);

	return v;
}